

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
          (ExtensionSet *this,int start_field_number,int end_field_number,uint8 *target,
          EpsCopyOutputStream *stream)

{
  ushort uVar1;
  _Rb_tree_node_base *p_Var2;
  difference_type __d;
  ulong uVar3;
  ulong uVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr *pp_Var7;
  _Base_ptr *pp_Var8;
  ulong uVar4;
  
  pp_Var7 = (_Base_ptr *)(this->map_).large;
  if (this->flat_capacity_ < 0x101) {
    uVar1 = this->flat_size_;
    uVar4 = (ulong)uVar1;
    pp_Var8 = pp_Var7 + (ulong)uVar1 * 4;
    if (uVar1 != 0) {
      do {
        uVar3 = uVar4 >> 1;
        uVar5 = uVar3;
        if (*(int *)(pp_Var7 + uVar3 * 4) < start_field_number) {
          uVar5 = ~uVar3 + uVar4;
          pp_Var7 = pp_Var7 + uVar3 * 4 + 4;
        }
        uVar4 = uVar5;
      } while (0 < (long)uVar5);
    }
    for (; (pp_Var7 != pp_Var8 && (*(int *)pp_Var7 < end_field_number)); pp_Var7 = pp_Var7 + 4) {
      target = Extension::InternalSerializeFieldWithCachedSizesToArray
                         ((Extension *)(pp_Var7 + 1),*(int *)pp_Var7,target,stream);
    }
  }
  else {
    p_Var6 = (_Rb_tree_node_base *)(pp_Var7 + 1);
    for (p_Var2 = pp_Var7[2]; p_Var2 != (_Rb_tree_node_base *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < start_field_number]) {
      if (start_field_number <= (int)p_Var2[1]._M_color) {
        p_Var6 = p_Var2;
      }
    }
    for (; (p_Var6 != (_Rb_tree_node_base *)(pp_Var7 + 1) &&
           ((int)p_Var6[1]._M_color < end_field_number));
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      target = Extension::InternalSerializeFieldWithCachedSizesToArray
                         ((Extension *)&p_Var6[1]._M_parent,p_Var6[1]._M_color,target,stream);
    }
  }
  return target;
}

Assistant:

uint8* ExtensionSet::InternalSerializeWithCachedSizesToArray(
    int start_field_number, int end_field_number, uint8* target,
    io::EpsCopyOutputStream* stream) const {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    const auto& end = map_.large->end();
    for (auto it = map_.large->lower_bound(start_field_number);
         it != end && it->first < end_field_number; ++it) {
      target = it->second.InternalSerializeFieldWithCachedSizesToArray(
          it->first, target, stream);
    }
    return target;
  }
  const KeyValue* end = flat_end();
  for (const KeyValue* it = std::lower_bound(
           flat_begin(), end, start_field_number, KeyValue::FirstComparator());
       it != end && it->first < end_field_number; ++it) {
    target = it->second.InternalSerializeFieldWithCachedSizesToArray(
        it->first, target, stream);
  }
  return target;
}